

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O1

void __thiscall
duckdb::NotImplementedException::
NotImplementedException<char_const*,char_const*,std::__cxx11::string>
          (NotImplementedException *this,string *msg,char *params,char *params_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_2)

{
  pointer pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  string local_50;
  
  pcVar1 = (params_2->_M_dataplus)._M_p;
  local_70[0] = local_60;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)local_70,pcVar1,pcVar1 + params_2->_M_string_length);
  Exception::ConstructMessage<char_const*,char_const*,std::__cxx11::string>
            (&local_50,(Exception *)msg,(string *)params,params_1,(char *)local_70,in_R9);
  Exception::Exception(&this->super_Exception,NOT_IMPLEMENTED,&local_50);
  *(undefined ***)&this->super_Exception = &PTR__runtime_error_0199e448;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if (local_70[0] != local_60) {
    operator_delete(local_70[0]);
  }
  return;
}

Assistant:

explicit NotImplementedException(const string &msg, ARGS... params)
	    : NotImplementedException(ConstructMessage(msg, params...)) {
	}